

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.h
# Opt level: O3

string * __thiscall z80::to_string_abi_cxx11_(string *__return_storage_ptr__,z80 *this,OpCode o)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "halt";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "ret";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "xor";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "ld";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "jp";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "call";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "ex";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "dec";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "inc";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "add";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "sub";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "cp";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "push";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "pop";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(const OpCode o) {
		switch (o) {
			case OpCode::_xor:
				return "xor";
			case OpCode::ld:
				return "ld";
			case OpCode::call:
				return "call";
			case OpCode::ret:
				return "ret";
			case OpCode::ex:
				return "ex";
			case OpCode::jp:
				return "jp";
			case OpCode::halt:
				return "halt";
			case OpCode::dec:
				return "dec";
			case OpCode::inc:
				return "inc";
			case OpCode::cp:
				return "cp";
			case OpCode::add:
				return "add";
			case OpCode::sub:
				return "sub";
			case OpCode::push:
				return "push";
			case OpCode::pop:
				return "pop";
			default:
				return "unknown";
		}
		return "unknown";
	}